

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O0

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
::updateIntercept(GeometryShop<amrex::EB2::TranslationIF<amrex::EB2::LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>_>,_int>
                  *this,Array<Array4<Real>,_3> *inter_arr,Array<Array4<const_Type_t>,_3> *type_arr,
                 Array4<const_double> *lst,Geometry *geom)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long *in_RCX;
  CoordSys *in_R8;
  bool is_nan;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx;
  Array4<const_unsigned_int> *type;
  Array4<double> *inter;
  int idim;
  GpuArray<double,_3U> *problo;
  GpuArray<double,_3U> *dx;
  Array4<double> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  int iVar8;
  int local_428;
  int local_424;
  int local_3e4;
  int local_3e0;
  int iStack_3dc;
  int iStack_3d8;
  int local_3d4;
  int iStack_3d0;
  const_reference local_3c8;
  const_reference local_3c0;
  int local_3b4;
  double local_3b0 [3];
  double *local_398;
  GpuArray<double,_3U> local_390;
  GpuArray<double,_3U> *local_378;
  long *local_368;
  int *local_338;
  undefined4 local_324;
  int *local_320;
  undefined4 local_314;
  int *local_310;
  undefined4 local_304;
  int *local_300;
  int *local_2e8;
  undefined4 local_2d4;
  int *local_2d0;
  undefined4 local_2c4;
  int *local_2c0;
  undefined4 local_2b4;
  int *local_2b0;
  undefined4 local_2a4;
  GpuArray<double,_3U> *local_2a0;
  undefined4 local_294;
  double *local_290;
  undefined4 local_284;
  GpuArray<double,_3U> *local_280;
  undefined4 local_274;
  double *local_270;
  undefined4 local_264;
  GpuArray<double,_3U> *local_260;
  undefined4 local_254;
  double *local_250;
  undefined4 local_244;
  GpuArray<double,_3U> *local_240;
  undefined4 local_234;
  double *local_230;
  undefined4 local_224;
  GpuArray<double,_3U> *local_220;
  undefined4 local_214;
  double *local_210;
  undefined4 local_204;
  GpuArray<double,_3U> *local_200;
  undefined4 local_1f4;
  double *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  const_reference local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  const_reference local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  const_reference local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  const_reference local_190;
  int local_184;
  int local_180;
  int local_17c;
  const_reference local_178;
  int local_16c;
  int local_168;
  int local_164;
  const_reference local_160;
  int local_154;
  int local_150;
  int local_14c;
  const_reference local_148;
  int local_13c;
  int local_138;
  int local_134;
  const_reference local_130;
  double local_128;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  int local_44;
  int local_40;
  int local_3c;
  long *local_38;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_368 = in_RCX;
  CoordSys::CellSizeArray(&local_390,in_R8);
  local_378 = &local_390;
  Geometry::ProbLoArray((Geometry *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_398 = local_3b0;
  local_3b4 = 0;
  do {
    if (2 < local_3b4) {
      return;
    }
    local_3c0 = std::array<amrex::Array4<double>,_3UL>::operator[]
                          ((array<amrex::Array4<double>,_3UL> *)
                           CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           (size_type)in_stack_fffffffffffffbb8);
    local_3c8 = std::array<amrex::Array4<const_unsigned_int>,_3UL>::operator[]
                          ((array<amrex::Array4<const_unsigned_int>,_3UL> *)
                           CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           (size_type)in_stack_fffffffffffffbb8);
    Box::Box<double>((Box *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbb8);
    iVar6 = iStack_3d0;
    iVar5 = local_3d4;
    iVar4 = iStack_3d8;
    iVar3 = local_3e4;
    local_304 = 0;
    local_314 = 1;
    iVar2 = local_3e0;
    local_324 = 2;
    local_2b0 = &iStack_3d8;
    local_2b4 = 0;
    local_2c0 = &iStack_3d8;
    local_2c4 = 1;
    local_2d0 = &iStack_3d8;
    local_2d4 = 2;
    local_338 = &local_3e4;
    local_320 = &local_3e4;
    local_310 = &local_3e4;
    local_300 = &local_3e4;
    local_2e8 = &local_3e4;
    for (local_424 = iStack_3dc; local_428 = iVar2, local_424 <= iVar6; local_424 = local_424 + 1) {
      for (; iVar8 = iVar3, local_428 <= iVar5; local_428 = local_428 + 1) {
        for (; iVar8 <= iVar4; iVar8 = iVar8 + 1) {
          local_130 = local_3c8;
          local_138 = local_428;
          local_13c = local_424;
          local_134 = iVar8;
          if (local_3c8->p
              [(long)(iVar8 - (local_3c8->begin).x) +
               (long)(local_428 - (local_3c8->begin).y) * local_3c8->jstride +
               (long)(local_424 - (local_3c8->begin).z) * local_3c8->kstride] == 2) {
            local_148 = local_3c0;
            local_150 = local_428;
            local_154 = local_424;
            local_128 = local_3c0->p
                        [(long)(iVar8 - (local_3c0->begin).x) +
                         (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
                         (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride];
            local_14c = iVar8;
            uVar7 = std::isnan(local_128);
            in_stack_fffffffffffffbc7 = (undefined1)uVar7;
            if (local_3b4 == 0) {
              local_8 = local_368;
              local_10 = local_428;
              local_14 = local_424;
              dVar1 = *(double *)
                       (*local_368 +
                       ((long)(iVar8 - (int)local_368[4]) +
                        (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                       (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8);
              local_c = iVar8;
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                local_20 = local_368;
                local_28 = local_428;
                local_2c = local_424;
                local_24 = iVar8;
                if ((*(double *)
                      (*local_368 +
                      ((long)(iVar8 - (int)local_368[4]) +
                       (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                      (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                   ((uVar7 & 1) == 0)) {
                  local_3c = iVar8 + 1;
                  local_38 = local_368;
                  local_40 = local_428;
                  local_44 = local_424;
                  dVar1 = *(double *)
                           (*local_368 +
                           ((long)(local_3c - (int)local_368[4]) +
                            (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                           (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_54 = iVar8 + 1;
                    local_50 = local_368;
                    local_58 = local_428;
                    local_5c = local_424;
                    if ((*(double *)
                          (*local_368 +
                          ((long)(local_54 - (int)local_368[4]) +
                           (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                          (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                       ((uVar7 & 1) == 0)) goto LAB_00753c3a;
                  }
                  local_210 = local_398;
                  local_214 = 0;
                  local_220 = local_378;
                  local_224 = 0;
                  local_178 = local_3c0;
                  local_180 = local_428;
                  local_184 = local_424;
                  local_3c0->p
                  [(long)(iVar8 - (local_3c0->begin).x) +
                   (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
                   (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                       (double)(iVar8 + 1) * local_378->arr[0] + *local_398;
                  local_17c = iVar8;
                  goto LAB_00753c3a;
                }
              }
              local_1f0 = local_398;
              local_1f4 = 0;
              local_200 = local_378;
              local_204 = 0;
              local_160 = local_3c0;
              local_168 = local_428;
              local_16c = local_424;
              local_3c0->p
              [(long)(iVar8 - (local_3c0->begin).x) +
               (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
               (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                   (double)iVar8 * local_378->arr[0] + *local_398;
              local_164 = iVar8;
            }
            else if (local_3b4 == 1) {
              local_68 = local_368;
              local_70 = local_428;
              local_74 = local_424;
              dVar1 = *(double *)
                       (*local_368 +
                       ((long)(iVar8 - (int)local_368[4]) +
                        (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                       (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8);
              local_6c = iVar8;
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                local_80 = local_368;
                local_88 = local_428;
                local_8c = local_424;
                local_84 = iVar8;
                if ((*(double *)
                      (*local_368 +
                      ((long)(iVar8 - (int)local_368[4]) +
                       (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                      (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                   ((uVar7 & 1) == 0)) {
                  local_a0 = local_428 + 1;
                  local_98 = local_368;
                  local_a4 = local_424;
                  dVar1 = *(double *)
                           (*local_368 +
                           ((long)(iVar8 - (int)local_368[4]) +
                            (long)(local_a0 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                           (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8);
                  local_9c = iVar8;
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_b8 = local_428 + 1;
                    local_b0 = local_368;
                    local_bc = local_424;
                    local_b4 = iVar8;
                    if ((*(double *)
                          (*local_368 +
                          ((long)(iVar8 - (int)local_368[4]) +
                           (long)(local_b8 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                          (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                       ((uVar7 & 1) == 0)) goto LAB_00753c3a;
                  }
                  local_250 = local_398;
                  local_254 = 1;
                  local_260 = local_378;
                  local_264 = 1;
                  local_1a8 = local_3c0;
                  local_1b0 = local_428;
                  local_1b4 = local_424;
                  local_3c0->p
                  [(long)(iVar8 - (local_3c0->begin).x) +
                   (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
                   (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                       (double)(local_428 + 1) * local_378->arr[1] + local_398[1];
                  local_1ac = iVar8;
                  goto LAB_00753c3a;
                }
              }
              local_230 = local_398;
              local_234 = 1;
              local_240 = local_378;
              local_244 = 1;
              local_190 = local_3c0;
              local_198 = local_428;
              local_19c = local_424;
              local_3c0->p
              [(long)(iVar8 - (local_3c0->begin).x) +
               (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
               (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                   (double)local_428 * local_378->arr[1] + local_398[1];
              local_194 = iVar8;
            }
            else {
              local_c8 = local_368;
              local_d0 = local_428;
              local_d4 = local_424;
              dVar1 = *(double *)
                       (*local_368 +
                       ((long)(iVar8 - (int)local_368[4]) +
                        (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                       (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8);
              local_cc = iVar8;
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                local_e0 = local_368;
                local_e8 = local_428;
                local_ec = local_424;
                local_e4 = iVar8;
                if ((*(double *)
                      (*local_368 +
                      ((long)(iVar8 - (int)local_368[4]) +
                       (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                      (long)(local_424 - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                   ((uVar7 & 1) == 0)) {
                  local_104 = local_424 + 1;
                  local_f8 = local_368;
                  local_100 = local_428;
                  dVar1 = *(double *)
                           (*local_368 +
                           ((long)(iVar8 - (int)local_368[4]) +
                            (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                           (long)(local_104 - (int)local_368[5]) * local_368[2]) * 8);
                  local_fc = iVar8;
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_11c = local_424 + 1;
                    local_110 = local_368;
                    local_118 = local_428;
                    local_114 = iVar8;
                    if ((*(double *)
                          (*local_368 +
                          ((long)(iVar8 - (int)local_368[4]) +
                           (long)(local_428 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                          (long)(local_11c - (int)local_368[5]) * local_368[2]) * 8) <= 0.0) ||
                       ((uVar7 & 1) == 0)) goto LAB_00753c3a;
                  }
                  local_290 = local_398;
                  local_294 = 2;
                  local_2a0 = local_378;
                  local_2a4 = 2;
                  local_1d8 = local_3c0;
                  local_1e0 = local_428;
                  local_1e4 = local_424;
                  local_3c0->p
                  [(long)(iVar8 - (local_3c0->begin).x) +
                   (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
                   (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                       (double)(local_424 + 1) * local_378->arr[2] + local_398[2];
                  local_1dc = iVar8;
                  goto LAB_00753c3a;
                }
              }
              local_270 = local_398;
              local_274 = 2;
              local_280 = local_378;
              local_284 = 2;
              local_1c0 = local_3c0;
              local_1c8 = local_428;
              local_1cc = local_424;
              local_3c0->p
              [(long)(iVar8 - (local_3c0->begin).x) +
               (long)(local_428 - (local_3c0->begin).y) * local_3c0->jstride +
               (long)(local_424 - (local_3c0->begin).z) * local_3c0->kstride] =
                   (double)local_424 * local_378->arr[2] + local_398[2];
              local_1c4 = iVar8;
            }
          }
LAB_00753c3a:
        }
      }
    }
    local_3b4 = local_3b4 + 1;
  } while( true );
}

Assistant:

void updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                          Array<Array4<Type_t const>,AMREX_SPACEDIM> const& type_arr,
                          Array4<Real const> const& lst, Geometry const& geom) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            Array4<Real> const& inter = inter_arr[idim];
            Array4<Type_t const> const& type = type_arr[idim];
            const Box bx{inter};
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                if (type(i,j,k) == Type::irregular) {
                    bool is_nan = amrex::isnan(inter(i,j,k));
                    if (idim == 0) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            // interp might still be quiet_nan because lst that
                            // was set to zero has been changed by FillBoundary
                            // at periodic bounadries.
                            inter(i,j,k) = problo[0] + i*dx[0];
                        }
                        else if (lst(i+1,j,k) == Real(0.0) ||
                                 (lst(i+1,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[0] + (i+1)*dx[0];
                        }
                    } else if (idim == 1) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + j*dx[1];
                        }
                        else if (lst(i,j+1,k) == Real(0.0) ||
                                 (lst(i,j+1,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + (j+1)*dx[1];
                        }
                    } else {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + k*dx[2];
                        }
                        else if (lst(i,j,k+1) == Real(0.0) ||
                                 (lst(i,j,k+1) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + (k+1)*dx[2];
                        }
                    }
                }
            });
        }
    }